

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O2

wchar_t lzh_read_pt_bitlen(lzh_stream *strm,wchar_t start,wchar_t end)

{
  lzh_br *br;
  wchar_t *pwVar1;
  lzh_dec *plVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  
  plVar2 = strm->ds;
  br = &plVar2->br;
  lVar8 = (long)start;
  if (start < end) {
    start = end;
  }
  do {
    if (end <= lVar8) {
      return start;
    }
    wVar4 = (plVar2->br).cache_avail;
    if (wVar4 < L'\x03') {
      wVar3 = lzh_br_fillup(strm,br);
      wVar4 = (plVar2->br).cache_avail;
      if (wVar4 < L'\x03' && wVar3 == L'\0') goto LAB_001ff048;
    }
    wVar3 = wVar4 + L'\xfffffffd';
    uVar6 = (uint)(br->cache_buffer >> ((byte)wVar3 & 0x3f)) & 7;
    if (uVar6 == 7) {
      if (wVar4 < L'\r') {
        wVar3 = lzh_br_fillup(strm,br);
        wVar4 = (plVar2->br).cache_avail;
        if (wVar4 < L'\r' && wVar3 == L'\0') {
LAB_001ff048:
          return (wchar_t)lVar8;
        }
      }
      iVar5 = 4;
      for (uVar7 = br->cache_buffer >> ((char)wVar4 - 0xdU & 0x3f); ((uint)uVar7 >> 9 & 1) != 0;
          uVar7 = (ulong)((uint)uVar7 * 2)) {
        iVar5 = iVar5 + 1;
      }
      uVar6 = iVar5 + 3;
      if (0x10 < uVar6) {
        return L'\xffffffff';
      }
      wVar3 = wVar4 - iVar5;
    }
    (plVar2->br).cache_avail = wVar3;
    (plVar2->pt).bitlen[lVar8] = (uchar)uVar6;
    lVar8 = lVar8 + 1;
    pwVar1 = (plVar2->pt).freq + uVar6;
    *pwVar1 = *pwVar1 + L'\x01';
  } while( true );
}

Assistant:

static int
lzh_read_pt_bitlen(struct lzh_stream *strm, int start, int end)
{
	struct lzh_dec *ds = strm->ds;
	struct lzh_br * br = &(ds->br);
	int c, i;

	for (i = start; i < end;) {
		/*
		 *  bit pattern     the number we need
		 *     000           ->  0
		 *     001           ->  1
		 *     010           ->  2
		 *     ...
		 *     110           ->  6
		 *     1110          ->  7
		 *     11110         ->  8
		 *     ...
		 *     1111111111110 ->  16
		 */
		if (!lzh_br_read_ahead(strm, br, 3))
			return (i);
		if ((c = lzh_br_bits(br, 3)) == 7) {
			int d;
			if (!lzh_br_read_ahead(strm, br, 13))
				return (i);
			d = lzh_br_bits(br, 13);
			while (d & 0x200) {
				c++;
				d <<= 1;
			}
			if (c > 16)
				return (-1);/* Invalid data. */
			lzh_br_consume(br, c - 3);
		} else
			lzh_br_consume(br, 3);
		ds->pt.bitlen[i++] = c;
		ds->pt.freq[c]++;
	}
	return (i);
}